

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

Instr * __thiscall LowererMD::LoadArgumentCount(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  uint32 offset_00;
  undefined4 *puVar3;
  RegOpnd *baseOpnd_00;
  IndirOpnd *newSrc;
  StackSym *pSVar4;
  SymOpnd *newSrc_00;
  StackSym *sym;
  size_t offset;
  RegOpnd *baseOpnd;
  Instr *instr_local;
  LowererMD *this_local;
  
  bVar2 = Func::IsLoopBody(this->m_func);
  if (bVar2) {
    pSVar4 = Func::GetLoopParamSym(this->m_func);
    if (pSVar4 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x26f,"(this->m_func->GetLoopParamSym())",
                         "this->m_func->GetLoopParamSym()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pSVar4 = Func::GetLoopParamSym(this->m_func);
    baseOpnd_00 = IR::RegOpnd::New(pSVar4,TyInt64,this->m_func);
    offset_00 = Js::InterpreterStackFrame::GetOffsetOfInSlotsCount();
    newSrc = IR::IndirOpnd::New(baseOpnd_00,offset_00,TyInt32,this->m_func,false);
    IR::Instr::SetSrc1(instr,&newSrc->super_Opnd);
  }
  else {
    pSVar4 = StackSym::New(TyVar,this->m_func);
    Func::SetArgOffset(this->m_func,pSVar4,0x18);
    newSrc_00 = IR::SymOpnd::New(&pSVar4->super_Sym,TyInt64,this->m_func);
    IR::Instr::SetSrc1(instr,&newSrc_00->super_Opnd);
  }
  instr->m_opcode = MOV;
  return instr->m_prev;
}

Assistant:

IR::Instr *
LowererMD::LoadArgumentCount(IR::Instr * instr)
{
    if (this->m_func->IsLoopBody())
    {
        // Pull the arg count from the interpreter frame instance that was passed in.
        // (The callinfo in the loop body's frame just shows the single parameter, the interpreter frame.)
        Assert(this->m_func->GetLoopParamSym());
        IR::RegOpnd *baseOpnd = IR::RegOpnd::New(this->m_func->GetLoopParamSym(), TyMachReg, this->m_func);
        size_t offset = Js::InterpreterStackFrame::GetOffsetOfInSlotsCount();
        instr->SetSrc1(IR::IndirOpnd::New(baseOpnd, (int32)offset, TyInt32, this->m_func));
    }
    else
    {
        StackSym *sym = StackSym::New(TyVar, this->m_func);
                this->m_func->SetArgOffset(sym, (Js::JavascriptFunctionArgIndex_CallInfo - Js::JavascriptFunctionArgIndex_Frame) * sizeof(Js::Var));
        instr->SetSrc1(IR::SymOpnd::New(sym, TyMachReg,  this->m_func));
    }

    instr->m_opcode = Js::OpCode::MOV;

    return instr->m_prev;
}